

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

void google::protobuf::compiler::java::ExtensionGenerator::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,bool immutable,
               ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer,Context *context)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar1;
  byte bVar2;
  bool bVar3;
  int x;
  Type field_type;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar4;
  Descriptor *pDVar5;
  char *pcVar6;
  Options *pOVar7;
  EnumDescriptor *descriptor_00;
  AlphaNum *pAVar8;
  int __c;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *field_00;
  AlphaNum *a_00;
  string *psVar9;
  AlphaNum local_450;
  AlphaNum local_420;
  AlphaNum local_3f0;
  string local_3c0;
  allocator<char> local_399;
  string_view local_398;
  string local_388 [32];
  AlphaNum local_368;
  AlphaNum local_338;
  string local_308;
  string local_2e8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  string singular_type;
  JavaType java_type;
  string local_1f0 [39];
  byte local_1c9;
  undefined1 local_1c8 [88];
  string local_170;
  AlphaNum local_150;
  string local_120;
  string local_100;
  AlphaNum local_e0;
  string local_b0;
  string local_90;
  string local_60;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *local_40;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Context *context_local;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_pointer_local;
  ClassNameResolver *name_resolver_local;
  string *psStack_18;
  bool immutable_local;
  string *scope_local;
  FieldDescriptor *descriptor_local;
  
  local_40 = (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)vars_pointer;
  vars = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)context;
  context_local = (Context *)vars_pointer;
  vars_pointer_local =
       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local._7_1_ = immutable;
  psStack_18 = scope;
  scope_local = (string *)descriptor;
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[6]> *)0x2032b53);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)scope);
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_60,(java *)scope_local,field);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[5]> *)0x1d1c66d);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pfVar1 = vars_pointer_local;
  pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)scope_local);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_90,(ClassNameResolver *)pfVar1,pDVar5,(bool)(name_resolver_local._7_1_ & 1));
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[16]> *)"containing_type");
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  x = FieldDescriptor::number((FieldDescriptor *)scope_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e0,x);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)&local_e0,a);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[7]> *)0x1ddb344);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  FieldConstantName_abi_cxx11_(&local_100,(java *)scope_local,field_00);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[14]> *)0x1fdc80a);
  psVar9 = &local_100;
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  pcVar6 = FieldDescriptor::index((FieldDescriptor *)scope_local,(char *)psVar9,__c);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_150,(int)pcVar6);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_120,(lts_20250127 *)&local_150,a_00);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[6]> *)0x1d2f5b9);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)scope_local);
  psVar9 = scope_local;
  bVar2 = name_resolver_local._7_1_;
  pfVar1 = vars_pointer_local;
  local_1c8[0x56] = 0;
  local_1c9 = 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    local_1c8[0x56] = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,anon_var_dwarf_37cdd0 + 5,(allocator<char> *)(local_1c8 + 0x57))
    ;
  }
  else {
    pOVar7 = Context::options((Context *)vars);
    Options::Options((Options *)local_1c8,pOVar7);
    local_1c9 = 1;
    vars_pointer = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1c8;
    DefaultValue_abi_cxx11_
              (&local_170,(java *)psVar9,(FieldDescriptor *)(ulong)(bVar2 & 1),SUB81(pfVar1,0),
               (ClassNameResolver *)vars_pointer,(Options *)context);
  }
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[8]> *)0x1d72b62);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  if ((local_1c9 & 1) != 0) {
    Options::~Options((Options *)local_1c8);
  }
  if ((local_1c8[0x56] & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(local_1c8 + 0x57));
  }
  field_type = GetType((FieldDescriptor *)scope_local);
  _java_type = FieldTypeName(field_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_1f0,(basic_string_view<char,_std::char_traits<char>_> *)&java_type,
             (allocator<char> *)(singular_type.field_2._M_local_buf + 0xf));
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[14]> *)"type_constant");
  std::__cxx11::string::operator=((string *)pbVar4,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(singular_type.field_2._M_local_buf + 0xf));
  bVar3 = FieldDescriptor::is_packed((FieldDescriptor *)scope_local);
  pcVar6 = "optional_bool: false";
  if (bVar3) {
    pcVar6 = "Saw json_name: true";
  }
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[7]> *)0x20c6a34);
  std::__cxx11::string::operator=((string *)pbVar4,pcVar6 + 0xf);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[9]> *)"enum_map");
  std::__cxx11::string::operator=((string *)pbVar4,"null");
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[10]> *)0x1d5f3aa);
  std::__cxx11::string::operator=((string *)pbVar4,"null");
  singular_type.field_2._8_4_ = GetJavaType((FieldDescriptor *)scope_local);
  std::__cxx11::string::string((string *)local_228);
  pfVar1 = vars_pointer_local;
  switch(singular_type.field_2._8_4_) {
  case 5:
    std::__cxx11::string::operator=((string *)local_228,"java.lang.String");
    break;
  case 6:
    pcVar6 = "byte[]";
    if ((name_resolver_local._7_1_ & 1) != 0) {
      pcVar6 = "com.google.protobuf.ByteString";
    }
    std::__cxx11::string::operator=((string *)local_228,pcVar6);
    break;
  case 7:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)scope_local);
    pAVar8 = (AlphaNum *)(ulong)(name_resolver_local._7_1_ & 1);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_2e8,(ClassNameResolver *)pfVar1,descriptor_00,
               SUB41(name_resolver_local._7_1_ & 1,0));
    std::__cxx11::string::operator=((string *)local_228,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_368,".internalGetValueMap()");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_308,(lts_20250127 *)&local_338,&local_368,pAVar8);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_40,(key_arg<char[9]> *)"enum_map");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    break;
  case 8:
    pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)scope_local);
    pAVar8 = (AlphaNum *)(ulong)(name_resolver_local._7_1_ & 1);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_248,(ClassNameResolver *)pfVar1,pDVar5,SUB41(name_resolver_local._7_1_ & 1,0))
    ;
    std::__cxx11::string::operator=((string *)local_228,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2c8,".getDefaultInstance()");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_268,(lts_20250127 *)&local_298,&local_2c8,pAVar8);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_40,(key_arg<char[10]> *)0x1d5f3aa);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    break;
  default:
    local_398 = BoxedPrimitiveTypeName(singular_type.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_388,&local_398,&local_399);
    std::__cxx11::string::operator=((string *)local_228,local_388);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator(&local_399);
  }
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)scope_local);
  if (bVar3) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3f0,"java.util.List<");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_420,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_450,">");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_3c0,(lts_20250127 *)&local_3f0,&local_420,&local_450,(AlphaNum *)vars_pointer)
    ;
  }
  else {
    std::__cxx11::string::string((string *)&local_3c0,(string *)local_228);
  }
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[5]> *)0x1d73093);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_40,(key_arg<char[14]> *)"singular_type");
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  return;
}

Assistant:

void ExtensionGenerator::InitTemplateVars(
    const FieldDescriptor* descriptor, const std::string& scope, bool immutable,
    ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* vars_pointer,
    Context* context) {
  absl::flat_hash_map<absl::string_view, std::string>& vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCaseCheckReserved(descriptor);
  vars["containing_type"] =
      name_resolver->GetClassName(descriptor->containing_type(), immutable);
  vars["number"] = absl::StrCat(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = absl::StrCat(descriptor->index());
  vars["default"] = descriptor->is_repeated()
                        ? ""
                        : DefaultValue(descriptor, immutable, name_resolver,
                                       context->options());
  vars["type_constant"] = std::string(FieldTypeName(GetType(descriptor)));
  vars["packed"] = descriptor->is_packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  std::string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type =
          name_resolver->GetClassName(descriptor->message_type(), immutable);
      vars["prototype"] = absl::StrCat(singular_type, ".getDefaultInstance()");
      break;
    case JAVATYPE_ENUM:
      singular_type =
          name_resolver->GetClassName(descriptor->enum_type(), immutable);
      vars["enum_map"] = absl::StrCat(singular_type, ".internalGetValueMap()");
      break;
    case JAVATYPE_STRING:
      singular_type = "java.lang.String";
      break;
    case JAVATYPE_BYTES:
      singular_type = immutable ? "com.google.protobuf.ByteString" : "byte[]";
      break;
    default:
      singular_type = std::string(BoxedPrimitiveTypeName(java_type));
      break;
  }
  vars["type"] = descriptor->is_repeated()
                     ? absl::StrCat("java.util.List<", singular_type, ">")
                     : singular_type;
  vars["singular_type"] = singular_type;
}